

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdpc.c
# Opt level: O0

void hdpc_generate_mat_faster(m256v *H,parameters *P)

{
  uint8_t uVar1;
  uint32_t c;
  uint32_t uVar2;
  long in_RSI;
  int i_1;
  m256v I_H;
  int a;
  int i;
  int j_1;
  int j;
  uint8_t val;
  m256v G_HDPC;
  uint32_t in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint32_t in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint8_t val_00;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int iVar3;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  m256v *in_stack_ffffffffffffffb0;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  
  m256v_get_subview(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  for (local_30 = 0; local_30 < *(int *)(in_RSI + 0x14); local_30 = local_30 + 1) {
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                 (uint8_t)(in_stack_ffffffffffffff94 >> 0x18));
    gf256_mul('\0','\0');
  }
  for (local_34 = *(int *)(in_RSI + 4) + *(int *)(in_RSI + 0x10) + -2; -1 < local_34;
      local_34 = local_34 + -1) {
    for (local_38 = 0; local_38 < *(int *)(in_RSI + 0x14); local_38 = local_38 + 1) {
      in_stack_ffffffffffffff9c = local_38;
      in_stack_ffffffffffffffa0 = local_34;
      m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      gf256_mul('\0','\0');
      m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                   (uint8_t)(in_stack_ffffffffffffff94 >> 0x18));
    }
    c = Rand(local_34 + 1,6,*(int *)(in_RSI + 0x14));
    in_stack_ffffffffffffff88 = c;
    in_stack_ffffffffffffff8c = local_34;
    uVar1 = m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         local_34,c);
    val_00 = (uint8_t)(in_stack_ffffffffffffff94 >> 0x18);
    gf256_add('\x01',uVar1);
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,val_00);
    uVar2 = Rand(local_34 + 1,7,*(int *)(in_RSI + 0x14) + -1);
    in_stack_ffffffffffffff94 = (c + uVar2 + 1) % *(uint *)(in_RSI + 0x14);
    in_stack_ffffffffffffff98 = local_34;
    uVar1 = m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffff94,c),in_stack_ffffffffffffff8c,
                         in_stack_ffffffffffffff88);
    gf256_add('\x01',uVar1);
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                 (uint8_t)(in_stack_ffffffffffffff94 >> 0x18));
    in_stack_ffffffffffffff90 = c;
  }
  m256v_get_subview(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  m256v_clear((m256v *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  for (iVar3 = 0; iVar3 < *(int *)(in_RSI + 0x14); iVar3 = iVar3 + 1) {
    m256v_set_el((m256v *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,
                 in_stack_ffffffffffffff98,(uint8_t)(in_stack_ffffffffffffff94 >> 0x18));
  }
  return;
}

Assistant:

void hdpc_generate_mat_faster(m256v* H, const parameters* P)
{
	assert(H->n_row == P->H);
	assert(H->n_col == P->L);

	/* Create G_HDPC */
	m256v G_HDPC = m256v_get_subview(H, 0, 0, P->H, P->Kprime + P->S);
	uint8_t val = 1;
	for (int j = 0; j < P->H; ++j) {
		m256v_set_el(&G_HDPC, j, P->Kprime + P->S - 1, val);
		val = gf256_mul(val, 2);
	}
	for (int j = P->Kprime + P->S - 2; j >= 0; --j) {
		/* Copy over previous column, multiplied by alpha */
		for (int i = 0; i < P->H; ++i) {
			m256v_set_el(&G_HDPC, i, j,
			  gf256_mul(2, m256v_get_el(&G_HDPC, i, j + 1)));
		}

		/* Add in the two flipped positions */
		int a = Rand(j + 1, 6, P->H);
		m256v_set_el(&G_HDPC, a, j,
		  gf256_add(1, m256v_get_el(&G_HDPC, a, j)));
		a = (a + Rand(j + 1, 7, P->H - 1) + 1) % P->H;
		m256v_set_el(&G_HDPC, a, j,
		  gf256_add(1, m256v_get_el(&G_HDPC, a, j)));
	}

	/* Create I_H */
	m256v I_H = m256v_get_subview(H, 0, P->Kprime + P->S, P->H, P->H);
	m256v_clear(&I_H);
	for (int i = 0; i < P->H; ++i) {
		m256v_set_el(&I_H, i, i, 1);
	}
}